

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_list.cpp
# Opt level: O0

void __thiscall sc_core::sc_plist_base::erase_all(sc_plist_base *this)

{
  sc_plist_elem *psVar1;
  undefined8 *in_RDI;
  handle_t h;
  handle_t p;
  sc_plist_elem *local_18;
  
  psVar1 = (sc_plist_elem *)*in_RDI;
  while (local_18 = psVar1, local_18 != (sc_plist_elem *)0x0) {
    psVar1 = local_18->next;
    if (local_18 != (sc_plist_elem *)0x0) {
      sc_plist_elem::~sc_plist_elem(local_18);
      sc_plist_elem::operator_delete(in_RDI,(size_t)local_18);
    }
  }
  *in_RDI = 0;
  in_RDI[1] = 0;
  return;
}

Assistant:

void
sc_plist_base::erase_all()
{
    handle_t p;
    for( handle_t h = head; h != 0; h = p ) {
        p = h->next;
        delete h;
    }
    head = 0;
    tail = 0;
}